

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Letter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  QStandardItem *pQVar2;
  TextElement *pTVar3;
  Element *pEVar4;
  QByteArrayView QVar5;
  PreviewDialog preview;
  QStandardItemModel model;
  Report report;
  AutoTableElement tableElement;
  TextElement footerText;
  TextElement titleElement;
  TextElement toElement;
  TextElement bodyElement;
  TextElement body2Element;
  int argc_local;
  TextElement signatureElement;
  TextElement fromElement;
  QApplication app;
  QByteArrayView local_28;
  
  argc_local = argc;
  QApplication::QApplication(&app,&argc_local,argv,0x60204);
  KDReports::Report::Report(&report,(QObject *)0x0);
  QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"Product",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setHorizontalHeaderItem((int)&model,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"Release Date",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setHorizontalHeaderItem((int)&model,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"KD Reports 1.0",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"August 21, 2007",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"KD Reports 1.1",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setItem((int)&model,1,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"November 25, 2008",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setItem((int)&model,1,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"KD Reports 1.2",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setItem((int)&model,2,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QObject::tr((QString *)&preview,"October, 2009",(char *)0x0,-1);
  QStandardItem::QStandardItem(pQVar2,(QString *)&preview);
  QStandardItemModel::setItem((int)&model,2,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::TextElement::TextElement(&fromElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QString::QString((QString *)&preview,"From:\n");
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(&fromElement,(QString *)&preview);
  QByteArrayView::QByteArrayView<31ul>(&local_28,&anon_var_dwarf_ea);
  QVar5.m_data = (storage_type *)local_28.m_size;
  QVar5.m_size = (qsizetype)&tableElement;
  QString::fromUtf8(QVar5);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(pTVar3,(QString *)&tableElement);
  QString::QString((QString *)&toElement,"Rysktorp\n");
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(pTVar3,(QString *)&toElement);
  QString::QString((QString *)&titleElement,"Sweden\n");
  KDReports::TextElement::operator<<(pTVar3,(QString *)&titleElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&titleElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&toElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&fromElement,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  _preview = 0;
  KDReports::TextElement::TextElement(&toElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QString::QString((QString *)&preview,"To:\n");
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(&toElement,(QString *)&preview);
  QString::QString((QString *)&tableElement,"All Qt Users Out There In The World\n");
  KDReports::TextElement::operator<<(pTVar3,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&toElement,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  QObject::tr((QString *)&preview,
              "Ever wanted to create a printed report from within your Qt application?\nLook no further!"
              ,(char *)0x0,-1);
  KDReports::TextElement::TextElement(&titleElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::TextElement::setPointSize(14.0);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&titleElement,(QColor *)0x84);
  KDReports::Report::addVerticalSpacing(10.0);
  _preview = 0;
  KDReports::TextElement::TextElement(&bodyElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::TextElement::setPointSize(10.0);
  QObject::tr((QString *)&preview,"Dear KDAB Customers,\n",(char *)0x0,-1);
  KDReports::TextElement::operator<<(&bodyElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QString::QString((QString *)&preview,
                   "we are happy to introduce the newest member of KDAB\'s line of industry leading software products: KD Reports. KD Reports is the Qt tool to easily create printable reports. It provides all necessary features for a variety of applications:\nReports can be created programmatically, using an easy to use C++ API, or data-driven, creating complete reports from XML sources. Report data can be retrieved from SQL data sources. If KDAB\'s KDChart package is available, reports can be garnished with different chart types. Watermarks, headers and footers are there as well. Reports can be previewed manually, directly send to be printer, or saved as PDF.\n"
                  );
  KDReports::TextElement::operator<<(&bodyElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&bodyElement,(QColor *)0x8);
  KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
  KDReports::AbstractTableElement::setBorder(1.0);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&tableElement,(QColor *)0x84);
  KDReports::Report::addVerticalSpacing(6.0);
  _preview = 0;
  KDReports::TextElement::TextElement(&body2Element,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::TextElement::setPointSize(10.0);
  QString::QString((QString *)&preview,
                   "Reporting is a rather general feature, and it seems a nice package providing this kind of functionality to complement Qt was looked for by many. We at KDAB hope to make the life of our customers more enjoyable with it. Let us know if we were successful!\n"
                  );
  KDReports::TextElement::operator<<(&body2Element,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&body2Element,(QColor *)0x8);
  KDReports::Report::addVerticalSpacing(30.0);
  _preview = 0;
  KDReports::TextElement::TextElement(&signatureElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QObject::tr((QString *)&preview,"Cheers,\n",(char *)0x0,-1);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(&signatureElement,(QString *)&preview);
  QObject::tr((QString *)&footerText,anon_var_dwarf_1bb,(char *)0x0,-1);
  KDReports::TextElement::operator<<(pTVar3,(QString *)&footerText);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&footerText);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&signatureElement,(QColor *)0x1);
  pEVar4 = (Element *)KDReports::Report::footer(&report,6);
  KDReports::HLineElement::HLineElement((HLineElement *)&preview);
  KDReports::Header::addElement(pEVar4,(AlignmentFlag)&preview);
  KDReports::HLineElement::~HLineElement((HLineElement *)&preview);
  _preview = 0;
  KDReports::TextElement::TextElement(&footerText,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QString::QString((QString *)&preview,"www.kdab.com | email: info@kdab.com | +46-563-540090");
  KDReports::TextElement::operator<<(&footerText,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::TextElement::setPointSize(8.0);
  pEVar4 = (Element *)KDReports::Report::footer(&report,6);
  KDReports::Header::addElement(pEVar4,(AlignmentFlag)&footerText);
  KDReports::PreviewDialog::PreviewDialog(&preview,&report,(QWidget *)0x0);
  iVar1 = QDialog::exec();
  KDReports::PreviewDialog::~PreviewDialog(&preview);
  KDReports::TextElement::~TextElement(&footerText);
  KDReports::TextElement::~TextElement(&signatureElement);
  KDReports::TextElement::~TextElement(&body2Element);
  KDReports::AutoTableElement::~AutoTableElement(&tableElement);
  KDReports::TextElement::~TextElement(&bodyElement);
  KDReports::TextElement::~TextElement(&titleElement);
  KDReports::TextElement::~TextElement(&toElement);
  KDReports::TextElement::~TextElement(&fromElement);
  QStandardItemModel::~QStandardItemModel(&model);
  KDReports::Report::~Report(&report);
  QApplication::~QApplication(&app);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    // Create a report
    KDReports::Report report;

    // create a table:
    QStandardItemModel model;
    model.setHorizontalHeaderItem(0, new QStandardItem(QObject::tr("Product")));
    model.setHorizontalHeaderItem(1, new QStandardItem(QObject::tr("Release Date")));
    int row = 0;
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.0")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("August 21, 2007")));
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.1")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("November 25, 2008")));
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.2")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("October, 2009")));

    // Add From: and To: information:
    KDReports::TextElement fromElement;
    fromElement << "From:\n"
                << QString::fromUtf8("Klarälvdalens Datakonsult AB\n") << "Rysktorp\n"
                << "Sweden\n";
    report.addElement(fromElement);
    report.addVerticalSpacing(10);
    KDReports::TextElement toElement;
    toElement << "To:\n"
              << "All Qt Users Out There In The World\n";
    report.addElement(toElement);
    report.addVerticalSpacing(10);

    // Add a text element for the title
    KDReports::TextElement titleElement(QObject::tr("Ever wanted to create a printed report from within your Qt application?\nLook no further!"));
    titleElement.setPointSize(14);
    report.addElement(titleElement, Qt::AlignCenter);

    // A bit of spacing (10 mm)
    report.addVerticalSpacing(10);

    // Add another text element, demonstrating "<<" operator
    KDReports::TextElement bodyElement;
    bodyElement.setPointSize(10);
    bodyElement << QObject::tr("Dear KDAB Customers,\n");
    bodyElement << "we are happy to introduce the newest member of KDAB's line of industry leading software"
                   " products: KD Reports. KD Reports is the Qt tool to easily create printable reports. It "
                   "provides all necessary features for a variety of applications:\n"
                   "Reports can be created programmatically, using an easy to use C++ API, or data-driven, "
                   "creating complete reports from XML sources. Report data "
                   "can be retrieved from SQL data sources. If KDAB's KDChart package is available, reports "
                   "can be garnished with different chart types. Watermarks, headers and footers are there "
                   "as well. Reports can be previewed manually, directly send to be printer, or saved as "
                   "PDF.\n";
    report.addElement(bodyElement, Qt::AlignJustify);

    // release date table:
    KDReports::AutoTableElement tableElement(&model);
    tableElement.setVerticalHeaderVisible(false);
    tableElement.setBorder(1);
    report.addElement(tableElement, Qt::AlignCenter);
    report.addVerticalSpacing(6);

    KDReports::TextElement body2Element;
    body2Element.setPointSize(10);
    body2Element << "Reporting is a rather general feature, and it seems a nice package providing this kind "
                    "of functionality to complement Qt was looked for by many. We at KDAB hope to make the "
                    "life of our customers more enjoyable with it. Let us know if we were successful!\n";
    report.addElement(body2Element, Qt::AlignJustify);
    report.addVerticalSpacing(30);
    KDReports::TextElement signatureElement;
    signatureElement << QObject::tr("Cheers,\n") << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");

    report.addElement(signatureElement);

    // add footer with contact information:
    report.footer().addElement(KDReports::HLineElement());
    KDReports::TextElement footerText;
    footerText << "www.kdab.com | email: info@kdab.com | +46-563-540090";
    footerText.setPointSize(8);
    report.footer().addElement(footerText, Qt::AlignCenter);

    // To show a print preview:
    KDReports::PreviewDialog preview(&report);
    return preview.exec();
}